

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  byte bVar1;
  long *plVar2;
  long in_RSI;
  IStringStream is;
  String buffer;
  double value;
  Value *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  allocator<char> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_fffffffffffffd50;
  char *__end;
  char *in_stack_fffffffffffffd58;
  allocator<char> *__beg;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  Location in_stack_fffffffffffffd98;
  Token *in_stack_fffffffffffffda0;
  String *in_stack_fffffffffffffda8;
  Reader *in_stack_fffffffffffffdb0;
  allocator<char> local_241;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  istringstream local_1e0 [407];
  allocator<char> local_49;
  string local_48 [32];
  double local_28 [2];
  long local_18;
  byte local_1;
  
  local_28[0] = 0.0;
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::istringstream::istringstream(local_1e0,local_48,_S_in);
  plVar2 = (long *)std::istream::operator>>(local_1e0,local_28);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((bVar1 & 1) == 0) {
    Value::Value((Value *)CONCAT17(bVar1,in_stack_fffffffffffffd60),
                 (double)in_stack_fffffffffffffd58);
    Value::operator=((Value *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd38);
    Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    local_1 = 1;
  }
  else {
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_18 + 8);
    __end = *(char **)(local_18 + 0x10);
    __beg = &local_241;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffd60),(char *)__beg,__end,
               (allocator<char> *)__lhs);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    local_1 = addError(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0
                       ,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator(&local_241);
  }
  std::__cxx11::istringstream::~istringstream(local_1e0);
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  String buffer(token.start_, token.end_);
  IStringStream is(buffer);
  if (!(is >> value))
    return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  decoded = value;
  return true;
}